

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_image<cert::OutputImage<cert::Color,120ul,10ul>>
               (ofstream *ppm,OutputImage<cert::Color,_120UL,_10UL> *frame)

{
  Color CVar1;
  OutputImage<cert::Color,_120UL,_10UL> *this;
  OutputImage<cert::Color,_120UL,_10UL> *pOVar2;
  ostream *poVar3;
  ostream *in_RDI;
  int b;
  int g;
  int r;
  int i;
  byte bStack_22;
  byte local_1b;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    this = (OutputImage<cert::Color,_120UL,_10UL> *)(long)local_14;
    pOVar2 = (OutputImage<cert::Color,_120UL,_10UL> *)
             cert::OutputImage<cert::Color,_120UL,_10UL>::size
                       ((OutputImage<cert::Color,_120UL,_10UL> *)0x1014c9);
    if (pOVar2 <= this) break;
    CVar1 = cert::OutputImage<cert::Color,_120UL,_10UL>::at(this,0);
    local_1b = CVar1.r;
    CVar1 = cert::OutputImage<cert::Color,_120UL,_10UL>::at(this,0);
    bStack_22 = CVar1.g;
    CVar1 = cert::OutputImage<cert::Color,_120UL,_10UL>::at(this,0);
    poVar3 = (ostream *)std::ostream::operator<<(in_RDI,(uint)local_1b);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bStack_22);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)CVar1.b);
    std::operator<<(poVar3,"\n");
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void print_image (std::ofstream& ppm, T const& frame)
{
	for (int i = 0; i < frame.size (); i++)
	{
		int r = static_cast<int> (frame.at (i).r);
		int g = static_cast<int> (frame.at (i).g);
		int b = static_cast<int> (frame.at (i).b);

		ppm << r << " " << g << " " << b << "\n";
	}
}